

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O1

void __thiscall logger::Channel::SetPrefix(Channel *this,string *prefix)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->PrefixLock);
  if (iVar1 == 0) {
    std::__cxx11::string::_M_assign((string *)&this->Prefix);
    pthread_mutex_unlock((pthread_mutex_t *)&this->PrefixLock);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void Channel::SetPrefix(const std::string& prefix)
{
    std::lock_guard<std::mutex> locker(PrefixLock);
    Prefix = prefix;
}